

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token)

{
  int iVar1;
  _Elt_pointer ppVVar2;
  ValueHolder *this_00;
  uint uVar3;
  double value;
  Char buffer [33];
  double local_a0;
  ValueHolder local_98 [2];
  undefined1 local_88 [32];
  ValueHolder local_68 [2];
  undefined1 local_58 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_a0 = 0.0;
  uVar3 = (int)token->end_ - (int)token->start_;
  if ((int)uVar3 < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98[0].bool_,"Unable to parse token length",
               (allocator<char> *)&local_48);
    addError(this,(string *)local_98,token,(Location)0x0);
    this_00 = local_98;
  }
  else {
    if (uVar3 < 0x21) {
      memcpy(local_98,token->start_,(ulong)(uVar3 & 0x3f));
      *(undefined1 *)((long)local_98 + (ulong)(uVar3 & 0x3f)) = 0;
      iVar1 = __isoc99_sscanf(local_98,&DAT_00172823,&local_a0);
    }
    else {
      local_98[0].string_ = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98);
      iVar1 = __isoc99_sscanf(local_98[0].int_,&DAT_00172823,&local_a0);
      std::__cxx11::string::~string((string *)&local_98[0].bool_);
    }
    if (iVar1 == 1) {
      Value::Value((Value *)local_98,local_a0);
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar2 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      Value::operator=(ppVVar2[-1],(Value *)local_98);
      Value::~Value((Value *)local_98);
      return true;
    }
    local_68[0].string_ = (char *)(local_68 + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,token->start_,token->end_);
    std::operator+(&local_48,"\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   &local_48,"\' is not a number.");
    addError(this,(string *)local_98,token,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_98[0].bool_);
    std::__cxx11::string::~string((string *)&local_48);
    this_00 = local_68;
  }
  std::__cxx11::string::~string((string *)&this_00->bool_);
  return false;
}

Assistant:

bool 
Reader::decodeDouble( Token &token )
{
   double value = 0;
   const int bufferSize = 32;
   int count;
   int length = int(token.end_ - token.start_);

   // Sanity check to avoid buffer overflow exploits.
   if (length < 0) {
      return addError( "Unable to parse token length", token );
   }

   // Avoid using a string constant for the format control string given to
   // sscanf, as this can cause hard to debug crashes on OS X. See here for more
   // info:
   //
   //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
   char format[] = "%lf";

   if ( length <= bufferSize )
   {
      Char buffer[bufferSize+1];
      memcpy( buffer, token.start_, length );
      buffer[length] = 0;
      count = sscanf( buffer, format, &value );
   }
   else
   {
      std::string buffer( token.start_, token.end_ );
      count = sscanf( buffer.c_str(), format, &value );
   }

   if ( count != 1 )
      return addError( "'" + std::string( token.start_, token.end_ ) + "' is not a number.", token );
   currentValue() = value;
   return true;
}